

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Caliper.cpp
# Opt level: O2

void __thiscall cali::Caliper::end_with_value_check(Caliper *this,Attribute *attr,Variant *data)

{
  ThreadData *pTVar1;
  pointer pCVar2;
  Node *pNVar3;
  uint64_t uVar4;
  anon_union_8_7_33918203_for_value aVar5;
  bool bVar6;
  uint prop;
  cali_id_t cVar7;
  ostream *poVar8;
  uint uVar9;
  cali_id_t key;
  mutex *pmVar10;
  Channel *channel;
  pointer pCVar11;
  Attribute local_2d0;
  string error;
  BlackboardEntry local_2a8;
  string local_278;
  string local_258;
  undefined1 local_238 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  element_type *local_218;
  anon_union_8_7_33918203_for_value aStack_210;
  int local_38;
  
  if (this->sT->stack_error != false) {
    return;
  }
  prop = Attribute::properties(attr);
  uVar9 = prop & 0x3c;
  if (attr->m_node == (Node *)0x0) {
    cVar7 = 0xffffffffffffffff;
  }
  else {
    cVar7 = attr->m_node->m_id;
  }
  key = (ulong)((prop >> 10 & 1) != 0) + 1;
  if ((prop & 1) != 0) {
    key = cVar7;
  }
  pTVar1 = this->sT;
  (pTVar1->lock).m_lock = (pTVar1->lock).m_lock + 1;
  if (uVar9 == 0x14) {
    anon_unknown.dwarf_36ee15::load_current_entry
              ((BlackboardEntry *)local_238,attr,key,&pTVar1->thread_blackboard);
    local_2a8.entry.m_value.m_v.type_and_size = (uint64_t)local_218;
    local_2a8.entry.m_value.m_v.value = aStack_210;
    local_2a8.merged_entry.m_value.m_v.value =
         (anon_union_8_7_33918203_for_value)local_228._M_allocated_capacity;
    local_2a8.entry.m_node = (Node *)local_228._8_8_;
    local_2a8.merged_entry.m_node = (Node *)local_238._0_8_;
    local_2a8.merged_entry.m_value.m_v.type_and_size = local_238._8_8_;
  }
  else {
    if (uVar9 != 0xc) goto LAB_001fc572;
    pmVar10 = &this->sG->process_blackboard_lock;
    std::mutex::lock(pmVar10);
    anon_unknown.dwarf_36ee15::load_current_entry
              ((BlackboardEntry *)local_238,attr,key,&this->sG->process_blackboard);
    local_2a8.entry.m_value.m_v.type_and_size = (uint64_t)local_218;
    local_2a8.entry.m_value.m_v.value = aStack_210;
    local_2a8.merged_entry.m_value.m_v.value =
         (anon_union_8_7_33918203_for_value)local_228._M_allocated_capacity;
    local_2a8.entry.m_node = (Node *)local_228._8_8_;
    local_2a8.merged_entry.m_node = (Node *)local_238._0_8_;
    local_2a8.merged_entry.m_value.m_v.type_and_size = local_238._8_8_;
    pthread_mutex_unlock((pthread_mutex_t *)pmVar10);
  }
  aVar5 = local_2a8.entry.m_value.m_v.value;
  uVar4 = local_2a8.entry.m_value.m_v.type_and_size;
  pNVar3 = local_2a8.entry.m_node;
  if (local_2a8.entry.m_node != (Node *)0x0) {
    local_238._0_8_ = local_2a8.entry.m_value.m_v.type_and_size;
    local_238._8_8_ = local_2a8.entry.m_value.m_v.value;
    bVar6 = operator!=(data,(Variant *)local_238);
    if (!bVar6) {
      if ((prop & 0x40) == 0) {
        pCVar2 = (this->sG->active_channels).
                 super__Vector_base<cali::Channel,_std::allocator<cali::Channel>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pCVar11 = (this->sG->active_channels).
                       super__Vector_base<cali::Channel,_std::allocator<cali::Channel>_>._M_impl.
                       super__Vector_impl_data._M_start; pCVar11 != pCVar2; pCVar11 = pCVar11 + 1) {
          local_278._M_dataplus._M_p =
               (pointer)(pCVar11->mP).
                        super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_238._0_8_ = uVar4;
          local_238._8_8_ = aVar5;
          error._M_dataplus._M_p = (pointer)this;
          util::
          callback<void(cali::Caliper*,cali::ChannelBody*,cali::Attribute_const&,cali::Variant_const&)>
          ::operator()((callback<void(cali::Caliper*,cali::ChannelBody*,cali::Attribute_const&,cali::Variant_const&)>
                        *)&(((element_type *)local_278._M_dataplus._M_p)->events).pre_end_evt,
                       (Caliper **)&error,(ChannelBody **)&local_278,attr,(Variant *)local_238);
        }
      }
      if (uVar9 == 0x14) {
        anon_unknown.dwarf_36ee15::handle_end
                  (attr,prop,&local_2a8,key,&this->sT->thread_blackboard,&this->sT->tree);
      }
      else {
        pmVar10 = &this->sG->process_blackboard_lock;
        std::mutex::lock(pmVar10);
        anon_unknown.dwarf_36ee15::handle_end
                  (attr,prop,&local_2a8,key,&this->sG->process_blackboard,&this->sT->tree);
        pthread_mutex_unlock((pthread_mutex_t *)pmVar10);
      }
      goto LAB_001fc572;
    }
  }
  local_2d0 = (Attribute)attr->m_node;
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  if (pNVar3 == (Node *)0x0) {
    std::__cxx11::string::assign((char *)&error);
  }
  else {
    std::__cxx11::string::assign((char *)&error);
    Attribute::name_abi_cxx11_((string *)local_238,&local_2d0);
    std::__cxx11::string::append((string *)&error);
    std::__cxx11::string::~string((string *)local_238);
    std::__cxx11::string::append((char *)&error);
    local_278._M_dataplus._M_p = (pointer)local_2a8.entry.m_value.m_v.type_and_size;
    local_278._M_string_length = (size_type)local_2a8.entry.m_value.m_v.value;
    Variant::to_string_abi_cxx11_((string *)local_238,(Variant *)&local_278);
    std::__cxx11::string::append((string *)&error);
    std::__cxx11::string::~string((string *)local_238);
  }
  std::ofstream::ofstream(local_238);
  local_38 = 0;
  poVar8 = Log::stream((Log *)local_238);
  poVar8 = std::operator<<(poVar8,"Stack value mismatch: Trying to end ");
  Attribute::name_abi_cxx11_(&local_278,&local_2d0);
  poVar8 = std::operator<<(poVar8,(string *)&local_278);
  poVar8 = std::operator<<(poVar8,"=");
  Variant::to_string_abi_cxx11_(&local_258,data);
  poVar8 = std::operator<<(poVar8,(string *)&local_258);
  poVar8 = std::operator<<(poVar8," but ");
  poVar8 = std::operator<<(poVar8,(string *)&error);
  std::endl<char,std::char_traits<char>>(poVar8);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_278);
  std::ofstream::~ofstream(local_238);
  std::__cxx11::string::~string((string *)&error);
  this->sT->stack_error = true;
LAB_001fc572:
  (pTVar1->lock).m_lock = (pTVar1->lock).m_lock + -1;
  return;
}

Assistant:

void Caliper::end_with_value_check(const Attribute& attr, const Variant& data)
{
    if (sT->stack_error)
        return;

    int prop  = attr.properties();
    int scope = prop & CALI_ATTR_SCOPE_MASK;

    bool run_events = !(prop & CALI_ATTR_SKIP_EVENTS);

    cali_id_t key = get_blackboard_key(attr.id(), prop);
    BlackboardEntry current = { Entry(), Entry( ) };

    std::lock_guard<::siglock> g(sT->lock);

    if (scope == CALI_ATTR_SCOPE_THREAD)
        current = load_current_entry(attr, key, sT->thread_blackboard);
    else if (scope == CALI_ATTR_SCOPE_PROCESS) {
        std::lock_guard<std::mutex> gbb(sG->process_blackboard_lock);
        current = load_current_entry(attr, key, sG->process_blackboard);
    } else
        return;

    if (current.entry.empty() || data != current.entry.value()) {
        log_stack_value_error(current.entry, attr, data);
        sT->stack_error = true;
        return;
    }

    // invoke callbacks
    if (run_events)
        for (auto& channel : sG->active_channels)
            channel.mP->events.pre_end_evt(this, channel.body(), attr, current.entry.value());

    if (scope == CALI_ATTR_SCOPE_THREAD)
        handle_end(attr, prop, current, key, sT->thread_blackboard, sT->tree);
    else {
        std::lock_guard<std::mutex> gbb(sG->process_blackboard_lock);
        handle_end(attr, prop, current, key, sG->process_blackboard, sT->tree);
    }
}